

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readUnorm2101010RevOrder<rr::(anonymous_namespace)::NormalOrder>
               (Vec4 *dst,int size,void *ptr)

{
  uint uVar1;
  float *pfVar2;
  uint local_2c [2];
  deUint32 aligned;
  deUint32 range2;
  deUint32 range10;
  void *ptr_local;
  Vec4 *pVStack_10;
  int size_local;
  Vec4 *dst_local;
  
  aligned = 0x3ff;
  local_2c[1] = 3;
  _range2 = ptr;
  ptr_local._4_4_ = size;
  pVStack_10 = dst;
  ::deMemcpy(local_2c,ptr,4);
  uVar1 = local_2c[0] & 0x3ff;
  pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,0);
  *pfVar2 = (float)uVar1 / 1023.0;
  if (1 < ptr_local._4_4_) {
    uVar1 = local_2c[0] >> 10;
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,1);
    *pfVar2 = (float)(uVar1 & 0x3ff) / 1023.0;
  }
  if (2 < ptr_local._4_4_) {
    uVar1 = local_2c[0] >> 0x14;
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,2);
    *pfVar2 = (float)(uVar1 & 0x3ff) / 1023.0;
  }
  if (3 < ptr_local._4_4_) {
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,3);
    *pfVar2 = (float)(local_2c[0] >> 0x1e) / 3.0;
  }
  return;
}

Assistant:

inline void readUnorm2101010RevOrder (tcu::Vec4& dst, const int size, const void* ptr)
{
	const deUint32 range10 = (deUint32)((1ull << 10)-1);
	const deUint32 range2 = (deUint32)((1ull <<  2)-1);

	deUint32 aligned;
	deMemcpy(&aligned, ptr, sizeof(deUint32));

				   dst[Order::T0] = float((aligned >>  0) & ((1 << 10) - 1)) / float(range10);
	if (size >= 2) dst[Order::T1] = float((aligned >> 10) & ((1 << 10) - 1)) / float(range10);
	if (size >= 3) dst[Order::T2] = float((aligned >> 20) & ((1 << 10) - 1)) / float(range10);
	if (size >= 4) dst[Order::T3] = float((aligned >> 30) & ((1 <<  2) - 1)) / float(range2);
}